

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void trompeloeil::
     print_mismatch<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>,std::reference_wrapper<int>>
               (ostream *os,size_t num,
               predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<std::reference_wrapper<int>_&>,_int>
               *v,reference_wrapper<int> *p)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  void *extraout_RDX;
  string local_68;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prefix;
  reference_wrapper<int> *p_local;
  predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<std::reference_wrapper<int>_&>,_int>
  *v_local;
  size_t num_local;
  ostream *os_local;
  
  prefix.field_2._8_8_ = p;
  bVar1 = param_matches<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>,std::reference_wrapper<int>>
                    (v,p);
  if (!bVar1) {
    param_name_prefix_abi_cxx11_(&local_68,(trompeloeil *)v,extraout_RDX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,"_");
    std::__cxx11::string::~string((string *)&local_68);
    poVar3 = std::operator<<(os,"  Expected ");
    _Var2 = std::setw((num < 9) + 1);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    std::ostream::operator<<(poVar3,num + 1);
    print_expectation<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>
              (os,v);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void print_mismatch(
    std::ostream& os,
    size_t num,
    V const& v,
    P const& p)
  {
    if (!::trompeloeil::param_matches(v, p))
    {
      auto prefix = ::trompeloeil::param_name_prefix(&v) + "_";
      os << "  Expected " << std::setw((num < 9) ? 2 : 1) << prefix << num+1;
      ::trompeloeil::print_expectation(os, v);
    }
  }